

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

void __thiscall
math::wide_integer::uintwide_t<1024U,_unsigned_int,_void,_false>::shl<unsigned_long>
          (uintwide_t<1024U,_unsigned_int,_void,_false> *this,unsigned_long n)

{
  uint uVar1;
  ulong uVar2;
  const_iterator first;
  const_iterator it;
  uint *puVar3;
  iterator puVar4;
  uint *dest;
  iterator it_00;
  sbyte sVar5;
  local_integral_type right_shift_previous_value;
  uint *puStack_48;
  uint t;
  uint *ai;
  limb_type part_from_previous_value;
  unsigned_fast_type left_shift_amount;
  ulong local_28;
  unsigned_long local_20;
  unsigned_long offset;
  unsigned_long n_local;
  uintwide_t<24U,_unsigned_char,_void,_false> *this_local;
  
  local_28 = n >> 5;
  left_shift_amount = 0x20;
  offset = n;
  n_local = (unsigned_long)this;
  local_20 = detail::min_unsafe<unsigned_long>(&local_28,&left_shift_amount);
  uVar2 = offset & 0x1f;
  if (local_20 != 0) {
    first = detail::array_detail::array<unsigned_int,_32UL>::cbegin
                      ((array<unsigned_int,_32UL> *)this);
    it = detail::array_detail::array<unsigned_int,_32UL>::cbegin((array<unsigned_int,_32UL> *)this);
    puVar3 = detail::advance_and_point<unsigned_int_const*,unsigned_int>(it,0x20 - (int)local_20);
    puVar4 = detail::array_detail::array<unsigned_int,_32UL>::begin
                       ((array<unsigned_int,_32UL> *)this);
    dest = detail::advance_and_point<unsigned_int*,unsigned_int>(puVar4,0x20);
    detail::copy_backward_unsafe<unsigned_int_const*,unsigned_int*>(first,puVar3,dest);
    puVar4 = detail::array_detail::array<unsigned_int,_32UL>::begin
                       ((array<unsigned_int,_32UL> *)this);
    it_00 = detail::array_detail::array<unsigned_int,_32UL>::begin
                      ((array<unsigned_int,_32UL> *)this);
    puVar3 = detail::advance_and_point<unsigned_int*,unsigned_int>(it_00,(uint)local_20);
    detail::fill_unsafe<unsigned_int*,unsigned_int>(puVar4,puVar3,0);
  }
  if (uVar2 != 0) {
    ai._4_4_ = 0;
    puVar4 = detail::array_detail::array<unsigned_int,_32UL>::begin
                       ((array<unsigned_int,_32UL> *)this);
    puStack_48 = detail::advance_and_point<unsigned_int*,unsigned_long>(puVar4,local_20);
    while (puVar4 = detail::array_detail::array<unsigned_int,_32UL>::end
                              ((array<unsigned_int,_32UL> *)this), puStack_48 != puVar4) {
      uVar1 = *puStack_48;
      sVar5 = (sbyte)uVar2;
      *puStack_48 = uVar1 << sVar5 | ai._4_4_;
      ai._4_4_ = uVar1 >> (0x20U - sVar5 & 0x1f);
      puStack_48 = puStack_48 + 1;
    }
  }
  return;
}

Assistant:

constexpr auto shl(IntegralType n) -> void
    {
      const auto offset =
        (detail::min_unsafe)(static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) / static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits)),
                             static_cast<unsigned_fast_type>(number_of_limbs));

      const auto left_shift_amount = static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) % static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits));

      if(offset > static_cast<unsigned_fast_type>(UINT8_C(0)))
      {
        detail::copy_backward_unsafe(values.cbegin(),
                                     detail::advance_and_point(values.cbegin(), static_cast<size_t>(number_of_limbs - offset)),
                                     detail::advance_and_point(values.begin(), static_cast<size_t>(number_of_limbs)));

        detail::fill_unsafe(values.begin(), detail::advance_and_point(values.begin(), static_cast<size_t>(offset)), static_cast<limb_type>(UINT8_C(0)));
      }

      using local_integral_type = unsigned_fast_type;

      if(left_shift_amount != static_cast<local_integral_type>(UINT8_C(0)))
      {
        auto part_from_previous_value = static_cast<limb_type>(UINT8_C(0));

        auto ai = detail::advance_and_point(values.begin(), offset); // NOLINT(llvm-qualified-auto,readability-qualified-auto)

        while(ai != values.end()) // NOLINT(altera-id-dependent-backward-branch)
        {
          const auto t = *ai;

          *ai++ =
            static_cast<limb_type>
            (
                static_cast<limb_type>(t << static_cast<local_integral_type>(left_shift_amount))
              | part_from_previous_value
            );

          const auto right_shift_previous_value =
            static_cast<local_integral_type>
            (
              static_cast<unsigned_fast_type>
              (
                  static_cast<std::int_fast32_t>(std::numeric_limits<limb_type>::digits)
                - static_cast<std::int_fast32_t>(left_shift_amount)
              )
            );

          part_from_previous_value = static_cast<limb_type>(t >> right_shift_previous_value);
        }
      }
    }